

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall tcu::Texture2D::Texture2D(Texture2D *this,Texture2D *other)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  
  TextureLevelPyramid::TextureLevelPyramid
            (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
  iVar2 = other->m_height;
  this->m_width = other->m_width;
  this->m_height = iVar2;
  pCVar1 = &((this->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
  (this->m_view).m_numLevels =
       (int)((ulong)((long)(this->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 3) *
       -0x33333333;
  (this->m_view).m_levels = pCVar1;
  return;
}

Assistant:

Texture2D::Texture2D (const Texture2D& other)
	: TextureLevelPyramid	(other)
	, m_width				(other.m_width)
	, m_height				(other.m_height)
	, m_view				(getNumLevels(), getLevels())
{
}